

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_open(ion_bpp_open_t info,ion_bpp_handle_t *handle)

{
  ion_boolean_t iVar1;
  ion_err_t iVar2;
  ion_bpp_err_t iVar3;
  void *pvVar4;
  ion_file_handle_t pFVar5;
  ion_file_offset_t iVar6;
  long lVar7;
  char *local_50;
  ion_bpp_node_t *p;
  ion_bpp_buffer_t *piStack_40;
  int i;
  ion_bpp_buffer_t *root;
  long *plStack_30;
  int maxCt;
  ion_bpp_buffer_t *buf;
  int bufCt;
  ion_bpp_err_t rc;
  ion_bpp_h_node_t *h;
  ion_bpp_handle_t *handle_local;
  
  if ((info.sectorSize < 200) ||
     (((undefined1  [32])info & (undefined1  [32])0x3) != (undefined1  [32])0x0)) {
    handle_local._4_4_ = bErrSectorSize;
  }
  else {
    root._4_4_ = (int)((ulong)(long)((int)info.sectorSize + -0x27) / ((long)info.keySize + 0x10U));
    if (root._4_4_ < 6) {
      handle_local._4_4_ = bErrSectorSize;
    }
    else {
      h = (ion_bpp_h_node_t *)handle;
      _bufCt = (ion_file_handle_t)calloc(1,200);
      if (_bufCt == (ion_file_handle_t)0x0) {
        handle_local._4_4_ = lineError(0x3a0,bErrMemory);
      }
      else {
        *(int *)&_bufCt->_IO_read_ptr = info.keySize;
        *(ion_bpp_bool_t *)((long)&_bufCt->_IO_read_ptr + 4) = info.dupKeys;
        *(int *)&_bufCt->_IO_read_end = (int)info.sectorSize;
        _bufCt->_IO_read_base = (char *)info.comp;
        *(int *)((long)&_bufCt->__pad5 + 4) = *(int *)&_bufCt->_IO_read_ptr + 0x10;
        *(int *)&_bufCt->__pad5 = root._4_4_;
        buf._0_4_ = 7;
        pvVar4 = calloc(7,0x28);
        *(void **)&_bufCt->_fileno = pvVar4;
        if (pvVar4 == (void *)0x0) {
          handle_local._4_4_ = lineError(0x3b6,bErrMemory);
        }
        else {
          plStack_30 = *(long **)&_bufCt->_fileno;
          pvVar4 = malloc((long)(((int)buf + 6) * *(int *)&_bufCt->_IO_read_end +
                                *(int *)((long)&_bufCt->__pad5 + 4) * 2));
          _bufCt->_old_offset = (__off_t)pvVar4;
          if (pvVar4 == (void *)0x0) {
            handle_local._4_4_ = lineError(0x3c4,bErrMemory);
          }
          else {
            for (p._4_4_ = 0;
                p._4_4_ < ((int)buf + 6) * *(int *)&_bufCt->_IO_read_end +
                          *(int *)((long)&_bufCt->__pad5 + 4) * 2; p._4_4_ = p._4_4_ + 1) {
              *(undefined1 *)(_bufCt->_old_offset + (long)p._4_4_) = 0;
            }
            local_50 = (char *)_bufCt->_old_offset;
            _bufCt->_IO_save_base = (char *)plStack_30;
            _bufCt->_IO_backup_base = (char *)(plStack_30 + (long)((int)buf + -1) * 5);
            for (p._4_4_ = 0; p._4_4_ < (int)buf; p._4_4_ = p._4_4_ + 1) {
              *plStack_30 = (long)(plStack_30 + 5);
              plStack_30[1] = (long)(plStack_30 + -5);
              *(undefined4 *)((long)plStack_30 + 0x24) = 0;
              *(undefined4 *)(plStack_30 + 4) = 0;
              plStack_30[3] = (long)local_50;
              local_50 = local_50 + *(int *)&_bufCt->_IO_read_end;
              plStack_30 = plStack_30 + 5;
            }
            *(char ***)(_bufCt->_IO_save_base + 8) = &_bufCt->_IO_save_base;
            *(char ***)_bufCt->_IO_backup_base = &_bufCt->_IO_save_base;
            piStack_40 = (ion_bpp_buffer_t *)&_bufCt->_IO_write_base;
            _bufCt->_IO_buf_base = local_50;
            _bufCt->_codecvt = (_IO_codecvt *)(local_50 + *(int *)&_bufCt->_IO_read_end * 3);
            _bufCt->_freeres_list = (_IO_FILE *)0x0;
            _bufCt->_freeres_buf = (void *)0x0;
            iVar1 = ion_fexists(info.iName);
            if (iVar1 == '\0') {
              pFVar5 = ion_fopen(info.iName);
              *(ion_file_handle_t *)_bufCt = pFVar5;
              if (pFVar5 == (ion_file_handle_t)0x0) {
                free(_bufCt);
                return bErrFileNotOpen;
              }
              memset(piStack_40->p,0,(long)(*(int *)&_bufCt->_IO_read_end * 3));
              *(ushort *)piStack_40->p = *(ushort *)piStack_40->p & 0xfffe | 1;
              lVar7 = (long)(*(int *)&_bufCt->_IO_read_end * 3);
              _bufCt->_mode = (int)lVar7;
              _bufCt->_unused2[0] = (char)((ulong)lVar7 >> 0x20);
              _bufCt->_unused2[1] = (char)((ulong)lVar7 >> 0x28);
              _bufCt->_unused2[2] = (char)((ulong)lVar7 >> 0x30);
              _bufCt->_unused2[3] = (char)((ulong)lVar7 >> 0x38);
              piStack_40->modified = boolean_true;
              flushAll(_bufCt);
            }
            else {
              pFVar5 = ion_fopen(info.iName);
              *(ion_file_handle_t *)_bufCt = pFVar5;
              buf._4_4_ = readDisk(_bufCt,0,&stack0xffffffffffffffc0);
              if (buf._4_4_ != bErrOk) {
                return buf._4_4_;
              }
              iVar2 = ion_fseek(*(ion_file_handle_t *)_bufCt,0,2);
              if (iVar2 != '\0') {
                iVar3 = lineError(0x3f1,bErrIO);
                return iVar3;
              }
              iVar6 = ion_ftell(*(ion_file_handle_t *)_bufCt);
              _bufCt->_mode = (int)iVar6;
              _bufCt->_unused2[0] = (char)((ulong)iVar6 >> 0x20);
              _bufCt->_unused2[1] = (char)((ulong)iVar6 >> 0x28);
              _bufCt->_unused2[2] = (char)((ulong)iVar6 >> 0x30);
              _bufCt->_unused2[3] = (char)((ulong)iVar6 >> 0x38);
              if (iVar6 == -1) {
                iVar3 = lineError(0x3f5,bErrIO);
                return iVar3;
              }
            }
            h->fp = _bufCt;
            handle_local._4_4_ = bErrOk;
          }
        }
      }
    }
  }
  return handle_local._4_4_;
}

Assistant:

ion_bpp_err_t
b_open(
	ion_bpp_open_t		info,
	ion_bpp_handle_t	*handle
) {
	ion_bpp_h_node_t	*h;
	ion_bpp_err_t		rc;			/* return code */
	int					bufCt;	/* number of tmp buffers */
	ion_bpp_buffer_t	*buf;				/* buffer */
	int					maxCt;	/* maximum number of keys in a node */
	ion_bpp_buffer_t	*root;
	int					i;
	ion_bpp_node_t		*p;

	if ((info.sectorSize < sizeof(ion_bpp_h_node_t)) || (0 != info.sectorSize % 4)) {
		return bErrSectorSize;
	}

	/* determine sizes and offsets */
	/* leaf/n, prev, next, [childLT,key,rec]... childGE */
	/* ensure that there are at least 3 children/parent for gather/scatter */
	maxCt	= info.sectorSize - (sizeof(ion_bpp_node_t) - sizeof(ion_bpp_key_t));
	maxCt	/= sizeof(ion_bpp_address_t) + info.keySize + sizeof(ion_bpp_external_address_t);

	if (maxCt < 6) {
		return bErrSectorSize;
	}

	/* copy parms to ion_bpp_h_node_t */
	if ((h = calloc(1, sizeof(ion_bpp_h_node_t))) == NULL) {
		return error(bErrMemory);
	}

	h->keySize		= info.keySize;
	h->dupKeys		= info.dupKeys;
	h->sectorSize	= info.sectorSize;
	h->comp			= info.comp;

	/* childLT, key, rec */
	h->ks			= sizeof(ion_bpp_address_t) + h->keySize + sizeof(ion_bpp_external_address_t);
	h->maxCt		= maxCt;

	/* Allocate buflist.
	 * During insert/delete, need simultaneous access to 7 buffers:
	 *  - 4 adjacent child bufs
	 *  - 1 parent buf
	 *  - 1 next sequential link
	 *  - 1 lastGE
	*/
	bufCt			= 7;

	if ((h->malloc1 = calloc(bufCt, sizeof(ion_bpp_buffer_t))) == NULL) {
		return error(bErrMemory);
	}

	buf = h->malloc1;

	/*
	 * Allocate bufs.
	 * We need space for the following:
	 *  - bufCt buffers, of size sectorSize
	 *  - 1 buffer for root, of size 3*sectorSize
	 *  - 1 buffer for gbuf, size 3*sectorsize + 2 extra keys
	 *	to allow for LT pointers in last 2 nodes when gathering 3 full nodes
	*/
	if ((h->malloc2 = malloc((bufCt + 6) * h->sectorSize + 2 * h->ks)) == NULL) {
		return error(bErrMemory);
	}

	for (i = 0; i < (bufCt + 6) * h->sectorSize + 2 * h->ks; i++) {
		((char *) h->malloc2)[i] = 0;
	}

	p				= h->malloc2;

	/* initialize buflist */
	h->bufList.next = buf;
	h->bufList.prev = buf + (bufCt - 1);

	for (i = 0; i < bufCt; i++) {
		buf->next		= buf + 1;
		buf->prev		= buf - 1;
		buf->modified	= boolean_false;
		buf->valid		= boolean_false;
		buf->p			= p;
		p				= (ion_bpp_node_t *) ((char *) p + h->sectorSize);
		buf++;
	}

	h->bufList.next->prev	= &h->bufList;
	h->bufList.prev->next	= &h->bufList;

	/* initialize root */
	root					= &h->root;
	root->p					= p;
	p						= (ion_bpp_node_t *) ((char *) p + 3 * h->sectorSize);
	h->gbuf.p				= p;/* done last to include extra 2 keys */

	h->curBuf				= NULL;
	h->curKey				= NULL;

	/* initialize root */
	if (ion_fexists(info.iName)) {
		/* open an existing database */
		h->fp = ion_fopen(info.iName);

		if ((rc = readDisk(h, 0, &root)) != 0) {
			return rc;
		}

		if (ion_fseek(h->fp, 0, ION_FILE_END)) {
			return error(bErrIO);
		}

		if ((h->nextFreeAdr = ion_ftell(h->fp)) == -1) {
			return error(bErrIO);
		}
	}

#if defined(ARDUINO)
	else if (NULL != (h->fp = ion_fopen(info.iName)).file) {
#else
	else if (NULL != (h->fp = ion_fopen(info.iName))) {
#endif
		/* initialize root */
		memset(root->p, 0, 3 * h->sectorSize);
		leaf(root)		= 1;
		h->nextFreeAdr	= 3 * h->sectorSize;
		root->modified	= 1;
		flushAll(h);
	}